

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O3

cse_abstract * __thiscall
factory_item<xray_re::cse_alife_online_offline_group>::create
          (factory_item<xray_re::cse_alife_online_offline_group> *this)

{
  cse_alife_object *this_00;
  
  this_00 = (cse_alife_object *)operator_new(0x130);
  xray_re::cse_alife_object::cse_alife_object(this_00);
  (this_00->super_cse_abstract)._vptr_cse_abstract =
       (_func_int **)&PTR__cse_alife_online_offline_group_00248d78;
  this_00[1].super_cse_abstract._vptr_cse_abstract = (_func_int **)0x0;
  this_00[1].super_cse_abstract.m_s_name_replace._M_dataplus._M_p = (pointer)0x0;
  this_00[1].super_cse_abstract.m_s_name_replace._M_string_length = 0;
  (this_00->super_cse_abstract).m_clsid.field_0 = (this->super_factory_item_base).m_clsid.field_0;
  return &this_00->super_cse_abstract;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}